

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapAllocator.cpp
# Opt level: O1

void __thiscall Memory::HeapAllocator::ClearTrackAllocInfo(HeapAllocator *this,TrackAllocData *data)

{
  code *pcVar1;
  type_info *ptVar2;
  size_t sVar3;
  char *pcVar4;
  bool bVar5;
  long *plVar6;
  undefined4 *puVar7;
  
  plVar6 = (long *)__tls_get_addr(&PTR_0155ffb0);
  if (((*plVar6 == 0) && (plVar6[1] == 0)) && (plVar6[2] == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapAllocator.cpp"
                       ,0xd3,"(!nextAllocData.IsEmpty())","!nextAllocData.IsEmpty()");
    if (!bVar5) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar7 = 0;
  }
  if (data != (TrackAllocData *)0x0) {
    *(long *)&data->line = plVar6[4];
    ptVar2 = (type_info *)*plVar6;
    sVar3 = plVar6[1];
    pcVar4 = (char *)plVar6[3];
    data->count = plVar6[2];
    data->filename = pcVar4;
    data->typeinfo = ptVar2;
    data->plusSize = sVar3;
  }
  *plVar6 = 0;
  plVar6[1] = 0;
  plVar6[2] = 0;
  return;
}

Assistant:

void HeapAllocator::ClearTrackAllocInfo(TrackAllocData* data/* = NULL*/)
{
#ifdef HEAP_TRACK_ALLOC
    Assert(!nextAllocData.IsEmpty());
    if (data)
    {
        *data = nextAllocData;
    }
    nextAllocData.Clear();
#endif
}